

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O2

void * mi_malloc(size_t size)

{
  void *pvVar1;
  long in_FS_OFFSET;
  
  pvVar1 = mi_heap_malloc(*(mi_heap_t **)(in_FS_OFFSET + -0x58),size);
  return pvVar1;
}

Assistant:

void* mi_malloc(size_t size) mi_attr_noexcept {
  return mi_heap_malloc(mi_prim_get_default_heap(), size);
}